

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O1

ion_err_t linear_hash_read_state(linear_hash_table_t *linear_hash)

{
  int iVar1;
  size_t sVar2;
  ion_err_t iVar3;
  
  iVar1 = fseek((FILE *)linear_hash->state,0,0);
  iVar3 = '\r';
  if (iVar1 == 0) {
    sVar2 = fread(&linear_hash->initial_size,4,1,(FILE *)linear_hash->state);
    iVar3 = '\b';
    if (sVar2 == 1) {
      sVar2 = fread(&linear_hash->next_split,4,1,(FILE *)linear_hash->state);
      if (sVar2 == 1) {
        sVar2 = fread(&linear_hash->split_threshold,4,1,(FILE *)linear_hash->state);
        if (sVar2 == 1) {
          sVar2 = fread(&linear_hash->num_buckets,4,1,(FILE *)linear_hash->state);
          if (sVar2 == 1) {
            sVar2 = fread(&linear_hash->num_records,4,1,(FILE *)linear_hash->state);
            if (sVar2 == 1) {
              sVar2 = fread(&linear_hash->records_per_bucket,4,1,(FILE *)linear_hash->state);
              if (sVar2 == 1) {
                sVar2 = fread(linear_hash->bucket_map,4,1,(FILE *)linear_hash->state);
                if (sVar2 == 1) {
                  sVar2 = fwrite(&linear_hash->bucket_map->data,(long)linear_hash->num_buckets << 3,
                                 1,(FILE *)linear_hash->state);
                  iVar3 = (sVar2 != 1) << 3;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

ion_err_t
linear_hash_read_state(
	linear_hash_table_t *linear_hash
) {
	if (0 != fseek(linear_hash->state, 0, SEEK_SET)) {
		return err_file_bad_seek;
	}

	if (1 != fread(&(linear_hash->initial_size), sizeof(linear_hash->initial_size), 1, linear_hash->state)) {
		return err_file_read_error;
	}

	if (1 != fread(&linear_hash->next_split, sizeof(linear_hash->next_split), 1, linear_hash->state)) {
		return err_file_read_error;
	}

	if (1 != fread(&linear_hash->split_threshold, sizeof(linear_hash->split_threshold), 1, linear_hash->state)) {
		return err_file_read_error;
	}

	if (1 != fread(&linear_hash->num_buckets, sizeof(linear_hash->num_buckets), 1, linear_hash->state)) {
		return err_file_read_error;
	}

	if (1 != fread(&linear_hash->num_records, sizeof(linear_hash->num_records), 1, linear_hash->state)) {
		return err_file_read_error;
	}

	if (1 != fread(&linear_hash->records_per_bucket, sizeof(linear_hash->records_per_bucket), 1, linear_hash->state)) {
		return err_file_read_error;
	}

	if (1 != fread(&linear_hash->bucket_map->current_size, sizeof(int), 1, linear_hash->state)) {
		return err_file_read_error;
	}

	if (1 != fwrite(&linear_hash->bucket_map->data, sizeof(ion_fpos_t) * linear_hash->num_buckets, 1, linear_hash->state)) {
		return err_file_read_error;
	}

	return err_ok;
}